

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O1

void __thiscall Cache::loadBlockFromLowerLevel(Cache *this,uint32_t addr,uint32_t *cycles)

{
  uint32_t *puVar1;
  ulong uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  Cache *this_01;
  sbyte sVar3;
  pointer puVar4;
  byte extraout_AL;
  uint8_t uVar5;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint uVar6;
  uint32_t uVar7;
  long lVar8;
  double dVar9;
  Block replace_block;
  allocator_type local_89;
  undefined2 local_88;
  undefined2 uStack_86;
  uint32_t uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uint32_t uStack_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  undefined1 local_58 [16];
  pointer local_48;
  pointer local_40;
  
  dVar9 = 0.0;
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_84 = 0;
  uStack_80 = 0;
  uStack_7c = 0;
  uStack_78 = 0;
  local_88 = 1;
  uStack_84 = getTag(this,addr);
  dVar9 = log2(dVar9);
  log2(dVar9);
  sVar3 = (extraout_AL < 0x21) * (' ' - extraout_AL);
  uStack_80 = ((addr >> (extraout_EAX & 0x1f)) << sVar3) >> sVar3;
  uStack_7c = (this->policy).block_size;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,(ulong)uStack_7c,
             &local_89);
  puVar4 = local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_48;
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_58._0_8_;
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_58._8_8_;
  local_58 = ZEXT816(0) << 0x20;
  dVar9 = 0.0;
  local_48 = (pointer)0x0;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4);
  }
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_);
  }
  log2(dVar9);
  uVar6 = (addr >> (extraout_EAX_00 & 0x1f)) << (extraout_EAX_00 & 0x1f);
  if (uVar6 < uStack_7c + uVar6) {
    lVar8 = 0;
    do {
      this_01 = this->lower_cache;
      uVar7 = uVar6 + (int)lVar8;
      if (this_01 == (Cache *)0x0) {
        uVar5 = MemoryManager::getByteNoCache(this->memory,uVar7);
      }
      else if (lVar8 == 0) {
        uVar5 = getByte(this_01,uVar7,cycles);
      }
      else {
        uVar5 = getByteCopy(this_01,uVar7,(uint32_t *)0x0);
      }
      local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar8] = uVar5;
      uVar2 = (ulong)uVar6 + 1 + lVar8;
      lVar8 = lVar8 + 1;
    } while (uVar2 < uStack_7c + uVar6);
  }
  if (this->lower_cache == (Cache *)0x0) {
    puVar1 = &(this->statistics).cycle_cnt;
    *puVar1 = *puVar1 + 100;
    uVar7 = 100;
  }
  else {
    uVar7 = (this->lower_cache->policy).hit_latency;
    puVar1 = &(this->statistics).cycle_cnt;
    *puVar1 = *puVar1 + uVar7;
  }
  if (cycles != (uint32_t *)0x0) {
    *cycles = *cycles + uVar7;
  }
  uVar7 = getReplacementBlockId(this,uStack_80);
  Block::Block((Block *)local_58,
               (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar7);
  if (((this->write_back == true) && (local_58[0] == true)) && (local_58[1] == true)) {
    writeBlockToLowerLevel(this,(Block *)local_58,cycles);
  }
  this_00 = &(this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7].data;
  ((Block *)(this_00 + -1))->last_reference = uStack_78;
  *(bool *)&this_00[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (bool)(char)local_88;
  *(char *)((long)&this_00[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + 1) = (char)((ushort)local_88 >> 8);
  *(undefined2 *)
   ((long)&this_00[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 2) = uStack_86;
  *(uint32_t *)
   ((long)&this_00[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = uStack_84;
  *(uint32_t *)
   &this_00[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = uStack_80;
  *(uint *)((long)&this_00[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 4) = uStack_7c;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(this_00,&local_70);
  if (local_40 != (pointer)0x0) {
    operator_delete(local_40);
  }
  if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Cache::loadBlockFromLowerLevel(uint32_t addr, uint32_t *cycles) {
    // get block from memory or lower cache
    Block b;
    b.valid = true;
    b.dirty = false;
    b.tag = this->getTag(addr);
    b.id = this->getId(addr);
    b.size = this->policy.block_size;
    b.data = vector<uint8_t>(b.size);
    uint32_t bits = log2(b.size);
    uint32_t mask = ~((1 << bits) - 1);
    uint32_t block_begin_addr = addr & mask;
    for (uint32_t i = block_begin_addr; i < block_begin_addr + b.size; i++) {
        if (this->lower_cache == nullptr) {
            b.data[i - block_begin_addr] = this->memory->getByteNoCache(i);
        } else {
            if (i == block_begin_addr)
                b.data[i - block_begin_addr] = this->lower_cache->getByte(i, cycles);
            else
                b.data[i - block_begin_addr] = this->lower_cache->getByteCopy(i);
        }
    }
    if (this->lower_cache == nullptr) {
        this->statistics.cycle_cnt += 100;
        if (cycles)
            *cycles += 100;
    } else {
        this->statistics.cycle_cnt += this->lower_cache->policy.hit_latency;
        if (cycles)
            *cycles += this->lower_cache->policy.hit_latency;
    }

    // replace cache

    uint32_t replace_id = this->getReplacementBlockId(b.id);
    Block replace_block = this->blocks[replace_id];
    if (this->write_back && replace_block.valid && replace_block.dirty) {
        this->writeBlockToLowerLevel(replace_block, cycles);
    }
    this->blocks[replace_id] = b;
}